

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

int NULLCTypeInfo::IsFunction(int id)

{
  char *__function;
  char *__file;
  char *__assertion;
  
  if (linker == 0) {
    __assertion = "linker";
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
    ;
    __function = "int NULLCTypeInfo::IsFunction(int)";
  }
  else {
    if ((uint)id < *(uint *)(linker + 0x20c)) {
      return (int)(*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)(uint)id * 0x50) == 3);
    }
    __assertion = "index < count";
    __file = 
    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h";
    __function = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  __assert_fail(__assertion,__file,0x7f,__function);
}

Assistant:

int IsFunction(int id)
	{
		assert(linker);
		return linker->exTypes[id].subCat == ExternTypeInfo::CAT_FUNCTION;
	}